

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::CoreMLModels::WordTagger::ByteSizeLong(WordTagger *this)

{
  uint32 uVar1;
  TagsCase TVar2;
  int iVar3;
  long lVar4;
  string *psVar5;
  size_t sVar6;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  WordTagger *this_local;
  
  sStack_18 = 0;
  language_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = language_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sStack_18 + 1;
  }
  tokensoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = tokensoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  tokentagsoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = tokentagsoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  tokenlocationsoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = tokenlocationsoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  tokenlengthsoutputfeaturename_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = tokenlengthsoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  modelparameterdata_abi_cxx11_(this);
  lVar4 = std::__cxx11::string::size();
  if (lVar4 != 0) {
    psVar5 = modelparameterdata_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::BytesSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  uVar1 = revision(this);
  if (uVar1 != 0) {
    uVar1 = revision(this);
    sVar6 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar1);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  TVar2 = Tags_case(this);
  if ((TVar2 != TAGS_NOT_SET) && (TVar2 == kStringTags)) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>((this->Tags_).stringtags_);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar3;
  return sStack_18;
}

Assistant:

size_t WordTagger::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.WordTagger)
  size_t total_size = 0;

  // string language = 10;
  if (this->language().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->language());
  }

  // string tokensOutputFeatureName = 20;
  if (this->tokensoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->tokensoutputfeaturename());
  }

  // string tokenTagsOutputFeatureName = 21;
  if (this->tokentagsoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->tokentagsoutputfeaturename());
  }

  // string tokenLocationsOutputFeatureName = 22;
  if (this->tokenlocationsoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->tokenlocationsoutputfeaturename());
  }

  // string tokenLengthsOutputFeatureName = 23;
  if (this->tokenlengthsoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->tokenlengthsoutputfeaturename());
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->modelparameterdata());
  }

  // uint32 revision = 1;
  if (this->revision() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->revision());
  }

  switch (Tags_case()) {
    // .CoreML.Specification.StringVector stringTags = 200;
    case kStringTags: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Tags_.stringtags_);
      break;
    }
    case TAGS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}